

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitAssignmentToFuncName
               (ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfoParent
               )

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  PropertyId PVar4;
  undefined4 *puVar5;
  FunctionBody *this;
  Scope *this_00;
  FuncInfo *pFVar6;
  FuncInfo *pFVar7;
  Symbol *pSVar8;
  PropertyId propertyId_1;
  Symbol *fncScopeSym;
  PropertyId propertyId;
  Symbol *sym;
  FuncInfo *funcInfoParent_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeFnc *pnodeFnc_local;
  
  if ((pnodeFnc->pnodeName->super_ParseNode).nop != knopVarDecl) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x48d,"(pnodeFnc->pnodeName->nop == knopVarDecl)",
                       "pnodeFnc->pnodeName->nop == knopVarDecl");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar8 = pnodeFnc->pnodeName->sym;
  if (pSVar8 == (Symbol *)0x0) {
    return;
  }
  bVar2 = Symbol::GetIsFuncExpr(pSVar8);
  if (bVar2) {
    return;
  }
  bVar2 = Symbol::GetIsModuleExportStorage(pSVar8);
  if (bVar2) {
    ByteCodeGenerator::EmitPropStore
              (byteCodeGenerator,(pnodeFnc->super_ParseNode).location,pSVar8,(IdentPtr)0x0,
               funcInfoParent,false,false,false,false);
    return;
  }
  bVar2 = Symbol::GetIsGlobal(pSVar8);
  if (bVar2) {
    PVar4 = Symbol::GetPosition(pSVar8);
    ByteCodeGenerator::EmitGlobalFncDeclInit
              (byteCodeGenerator,(pnodeFnc->super_ParseNode).location,PVar4,funcInfoParent);
    uVar3 = ByteCodeGenerator::GetFlags(byteCodeGenerator);
    if ((uVar3 & 0x400) == 0) {
      return;
    }
    bVar2 = FuncInfo::GetIsStrictMode(funcInfoParent);
    if (bVar2) {
      return;
    }
    ByteCodeGenerator::EmitPropStore
              (byteCodeGenerator,(pnodeFnc->super_ParseNode).location,pSVar8,(IdentPtr)0x0,
               funcInfoParent,false,false,false,false);
    return;
  }
  bVar2 = Symbol::NeedsSlotAlloc(pSVar8,byteCodeGenerator,funcInfoParent);
  if (bVar2) {
    bVar2 = Symbol::GetHasNonCommittedReference(pSVar8);
    if (bVar2) {
      this = FuncInfo::GetParsedFunctionBody(funcInfoParent);
      bVar2 = Js::ParseableFunctionInfo::DoStackNestedFunc(&this->super_ParseableFunctionInfo);
      if (!bVar2) goto LAB_00b3329c;
    }
    Symbol::SetIsCommittedToSlot(pSVar8);
  }
LAB_00b3329c:
  this_00 = Symbol::GetScope(pSVar8);
  pFVar6 = Scope::GetFunc(this_00);
  pFVar7 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  if (pFVar6 == pFVar7) {
    ByteCodeGenerator::EmitLocalPropInit
              (byteCodeGenerator,(pnodeFnc->super_ParseNode).location,pSVar8,funcInfoParent);
  }
  else {
    ByteCodeGenerator::EmitPropStore
              (byteCodeGenerator,(pnodeFnc->super_ParseNode).location,pSVar8,(IdentPtr)0x0,
               funcInfoParent,false,false,false,false);
  }
  pSVar8 = Symbol::GetFuncScopeVarSym(pSVar8);
  if (pSVar8 != (Symbol *)0x0) {
    bVar2 = Symbol::GetIsGlobal(pSVar8);
    if ((bVar2) && (uVar3 = ByteCodeGenerator::GetFlags(byteCodeGenerator), (uVar3 & 0x400) != 0)) {
      PVar4 = Symbol::GetPosition(pSVar8);
      ByteCodeGenerator::EmitGlobalFncDeclInit
                (byteCodeGenerator,(pnodeFnc->super_ParseNode).location,PVar4,funcInfoParent);
    }
    else {
      ByteCodeGenerator::EmitPropStore
                (byteCodeGenerator,(pnodeFnc->super_ParseNode).location,pSVar8,(IdentPtr)0x0,
                 funcInfoParent,false,false,true,false);
    }
  }
  return;
}

Assistant:

void EmitAssignmentToFuncName(ParseNodeFnc *pnodeFnc, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfoParent)
{
    // Assign the location holding the func object reference to the given name.
    Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
    Symbol *sym = pnodeFnc->pnodeName->sym;

    if (sym != nullptr && !sym->GetIsFuncExpr())
    {
        if (sym->GetIsModuleExportStorage())
        {
            byteCodeGenerator->EmitPropStore(pnodeFnc->location, sym, nullptr, funcInfoParent);
        }
        else if (sym->GetIsGlobal())
        {
            Js::PropertyId propertyId = sym->GetPosition();
            byteCodeGenerator->EmitGlobalFncDeclInit(pnodeFnc->location, propertyId, funcInfoParent);
            if (byteCodeGenerator->GetFlags() & fscrEval && !funcInfoParent->GetIsStrictMode())
            {
                byteCodeGenerator->EmitPropStore(pnodeFnc->location, sym, nullptr, funcInfoParent);
            }
        }
        else
        {
            if (sym->NeedsSlotAlloc(byteCodeGenerator, funcInfoParent))
            {
                if (!sym->GetHasNonCommittedReference() ||
                    (funcInfoParent->GetParsedFunctionBody()->DoStackNestedFunc()))
                {
                    // No point in trying to optimize if there are no references before we have to commit to slot.
                    // And not safe to delay putting a stack function in the slot, since we may miss boxing.
                    sym->SetIsCommittedToSlot();
                }
            }

            if (sym->GetScope()->GetFunc() != byteCodeGenerator->TopFuncInfo())
            {
                byteCodeGenerator->EmitPropStore(pnodeFnc->location, sym, nullptr, funcInfoParent);
            }
            else
            {
                byteCodeGenerator->EmitLocalPropInit(pnodeFnc->location, sym, funcInfoParent);
            }

            Symbol * fncScopeSym = sym->GetFuncScopeVarSym();

            if (fncScopeSym)
            {
                if (fncScopeSym->GetIsGlobal() && byteCodeGenerator->GetFlags() & fscrEval)
                {
                    Js::PropertyId propertyId = fncScopeSym->GetPosition();
                    byteCodeGenerator->EmitGlobalFncDeclInit(pnodeFnc->location, propertyId, funcInfoParent);
                }
                else
                {
                    byteCodeGenerator->EmitPropStore(pnodeFnc->location, fncScopeSym, nullptr, funcInfoParent, false, false, /* isFncDeclVar */true);
                }
            }
        }
    }
}